

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O0

pboolean p_cond_variable_wait(PCondVariable *cond,PMutex *mutex)

{
  int iVar1;
  PMutex *mutex_local;
  PCondVariable *cond_local;
  
  if (cond == (PCondVariable *)0x0 || mutex == (PMutex *)0x0) {
    cond_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_cond_wait((pthread_cond_t *)cond,(pthread_mutex_t *)mutex);
    if (iVar1 == 0) {
      cond_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n","PCondVariable::p_cond_variable_wait: pthread_cond_wait() failed");
      cond_local._4_4_ = 0;
    }
  }
  return cond_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_cond_variable_wait (PCondVariable	*cond,
		      PMutex		*mutex)
{
	if (P_UNLIKELY (cond == NULL || mutex == NULL))
		return FALSE;

	/* Cast is eligible since there is only one field in the PMutex structure */
	if (P_UNLIKELY (pthread_cond_wait (&cond->hdl, (pthread_mutex_t *) mutex) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_wait: pthread_cond_wait() failed");
		return FALSE;
	}

	return TRUE;
}